

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O3

BOOL __thiscall
LASreadItemCompressed_POINT14_v4::createAndInitModelsAndDecompressors
          (LASreadItemCompressed_POINT14_v4 *this,U32 context,U8 *item)

{
  undefined8 *puVar1;
  I32 IVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  LAScontextPOINT14 *pLVar8;
  ArithmeticModel *pAVar9;
  IntegerCompressor *pIVar10;
  long lVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  
  if (this->contexts[context].unused != false) {
    pAVar9 = this->contexts[context].m_changed_values[0];
    if (pAVar9 == (ArithmeticModel *)0x0) {
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[0] = pAVar9;
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[1] = pAVar9;
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[2] = pAVar9;
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[3] = pAVar9;
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[4] = pAVar9;
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[5] = pAVar9;
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[6] = pAVar9;
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0x80);
      this->contexts[context].m_changed_values[7] = pAVar9;
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,3);
      this->contexts[context].m_scanner_channel = pAVar9;
      this->contexts[context].m_number_of_returns[0] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[1] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[2] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[3] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[4] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[5] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[6] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[7] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[8] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[9] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[10] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[0xb] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[0xc] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[0xd] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[0xe] = (ArithmeticModel *)0x0;
      this->contexts[context].m_number_of_returns[0xf] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[0] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[1] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[2] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[3] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[4] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[5] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[6] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[7] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[8] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[9] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[10] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[0xb] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[0xc] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[0xd] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[0xe] = (ArithmeticModel *)0x0;
      this->contexts[context].m_return_number[0xf] = (ArithmeticModel *)0x0;
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_channel_returns_XY,0xd);
      this->contexts[context].m_return_number_gps_same = pAVar9;
      pIVar10 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar10,this->dec_channel_returns_XY,0x20,2,8,0);
      this->contexts[context].ic_dX = pIVar10;
      pIVar10 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar10,this->dec_channel_returns_XY,0x20,0x16,8,0);
      this->contexts[context].ic_dY = pIVar10;
      pIVar10 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar10,this->dec_Z,0x20,0x14,8,0);
      this->contexts[context].ic_Z = pIVar10;
      memset(this->contexts[context].m_classification,0,0x600);
      pIVar10 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar10,this->dec_intensity,0x10,4,8,0);
      this->contexts[context].ic_intensity = pIVar10;
      pIVar10 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar10,this->dec_scan_angle,0x10,2,8,0);
      this->contexts[context].ic_scan_angle = pIVar10;
      pIVar10 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar10,this->dec_point_source,0x10,1,8,0);
      this->contexts[context].ic_point_source_ID = pIVar10;
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_gps_time,0x203);
      this->contexts[context].m_gpstime_multi = pAVar9;
      pAVar9 = ArithmeticDecoder::createSymbolModel(this->dec_gps_time,5);
      this->contexts[context].m_gpstime_0diff = pAVar9;
      pIVar10 = (IntegerCompressor *)operator_new(0x48);
      IntegerCompressor::IntegerCompressor(pIVar10,this->dec_gps_time,0x20,9,8,0);
      this->contexts[context].ic_gpstime = pIVar10;
      pAVar9 = this->contexts[context].m_changed_values[0];
    }
    ArithmeticDecoder::initSymbolModel(this->dec_channel_returns_XY,pAVar9,(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[1],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[2],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[3],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[4],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[5],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[6],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_changed_values[7],(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_scanner_channel,(U32 *)0x0);
    lVar11 = -0x10;
    do {
      pAVar9 = this->contexts[context].m_return_number[lVar11 + -1];
      if (pAVar9 != (ArithmeticModel *)0x0) {
        ArithmeticDecoder::initSymbolModel(this->dec_channel_returns_XY,pAVar9,(U32 *)0x0);
      }
      pAVar9 = this->contexts[context].m_classification[lVar11 + -3];
      if (pAVar9 != (ArithmeticModel *)0x0) {
        ArithmeticDecoder::initSymbolModel(this->dec_channel_returns_XY,pAVar9,(U32 *)0x0);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_channel_returns_XY,this->contexts[context].m_return_number_gps_same,
               (U32 *)0x0);
    IntegerCompressor::initDecompressor(this->contexts[context].ic_dX);
    IntegerCompressor::initDecompressor(this->contexts[context].ic_dY);
    lVar11 = -0x120;
    do {
      *(undefined4 *)((long)this->contexts[context].last_Y_diff_median5[0].values + lVar11 + 0x10) =
           0;
      puVar1 = (undefined8 *)((long)this->contexts[context].last_Y_diff_median5[0].values + lVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined1 *)((long)this->contexts[context].last_Y_diff_median5[0].values + lVar11 + 0x14) =
           1;
      puVar1 = (undefined8 *)((long)this->contexts[context].last_Z + lVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)this->contexts[context].last_Z + lVar11 + 0x10) = 0;
      *(undefined1 *)((long)this->contexts[context].last_Z + lVar11 + 0x14) = 1;
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0);
    IntegerCompressor::initDecompressor(this->contexts[context].ic_Z);
    IVar2 = *(I32 *)(item + 8);
    this->contexts[context].last_Z[0] = IVar2;
    this->contexts[context].last_Z[1] = IVar2;
    this->contexts[context].last_Z[2] = IVar2;
    this->contexts[context].last_Z[3] = IVar2;
    this->contexts[context].last_Z[4] = IVar2;
    this->contexts[context].last_Z[5] = IVar2;
    this->contexts[context].last_Z[6] = IVar2;
    this->contexts[context].last_Z[7] = IVar2;
    lVar11 = -0x40;
    do {
      pAVar9 = this->contexts[context].m_flags[lVar11];
      if (pAVar9 != (ArithmeticModel *)0x0) {
        ArithmeticDecoder::initSymbolModel(this->dec_classification,pAVar9,(U32 *)0x0);
      }
      pAVar9 = this->contexts[context].m_user_data[lVar11];
      if (pAVar9 != (ArithmeticModel *)0x0) {
        ArithmeticDecoder::initSymbolModel(this->dec_flags,pAVar9,(U32 *)0x0);
      }
      pAVar9 = (ArithmeticModel *)this->contexts[context].last_gpstime[lVar11 + -4].u64;
      if (pAVar9 != (ArithmeticModel *)0x0) {
        ArithmeticDecoder::initSymbolModel(this->dec_user_data,pAVar9,(U32 *)0x0);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0);
    IntegerCompressor::initDecompressor(this->contexts[context].ic_intensity);
    auVar13 = pshuflw(ZEXT416(*(uint *)(item + 0xc)),ZEXT416(*(uint *)(item + 0xc)),0);
    uVar12 = auVar13._0_4_;
    *(undefined4 *)this->contexts[context].last_intensity = uVar12;
    *(undefined4 *)(this->contexts[context].last_intensity + 2) = uVar12;
    *(undefined4 *)(this->contexts[context].last_intensity + 4) = uVar12;
    *(undefined4 *)(this->contexts[context].last_intensity + 6) = uVar12;
    IntegerCompressor::initDecompressor(this->contexts[context].ic_scan_angle);
    IntegerCompressor::initDecompressor(this->contexts[context].ic_point_source_ID);
    ArithmeticDecoder::initSymbolModel
              (this->dec_gps_time,this->contexts[context].m_gpstime_multi,(U32 *)0x0);
    ArithmeticDecoder::initSymbolModel
              (this->dec_gps_time,this->contexts[context].m_gpstime_0diff,(U32 *)0x0);
    IntegerCompressor::initDecompressor(this->contexts[context].ic_gpstime);
    this->contexts[context].last = 0;
    this->contexts[context].next = 0;
    pLVar8 = this->contexts + context;
    pLVar8->last_gpstime_diff[0] = 0;
    pLVar8->last_gpstime_diff[1] = 0;
    pLVar8->last_gpstime_diff[2] = 0;
    pLVar8->last_gpstime_diff[3] = 0;
    pLVar8 = this->contexts + context;
    pLVar8->multi_extreme_counter[0] = 0;
    pLVar8->multi_extreme_counter[1] = 0;
    pLVar8->multi_extreme_counter[2] = 0;
    pLVar8->multi_extreme_counter[3] = 0;
    this->contexts[context].last_gpstime[0] = *(U64I64F64 *)(item + 0x20);
    this->contexts[context].last_gpstime[1] = (U64I64F64)0x0;
    this->contexts[context].last_gpstime[2] = (U64I64F64)0x0;
    this->contexts[context].last_gpstime[3].u64 = 0;
    uVar3 = *(undefined8 *)item;
    uVar4 = *(undefined8 *)(item + 8);
    uVar5 = *(undefined8 *)(item + 0x18);
    uVar6 = *(undefined8 *)(item + 0x20);
    uVar7 = *(undefined8 *)(item + 0x28);
    *(undefined8 *)(this->contexts[context].last_item + 0x10) = *(undefined8 *)(item + 0x10);
    *(undefined8 *)(this->contexts[context].last_item + 0x18) = uVar5;
    *(undefined8 *)this->contexts[context].last_item = uVar3;
    *(undefined8 *)(this->contexts[context].last_item + 8) = uVar4;
    *(undefined8 *)(this->contexts[context].last_item + 0x20) = uVar6;
    *(undefined8 *)(this->contexts[context].last_item + 0x28) = uVar7;
    this->contexts[context].last_item[0x1c] = '\0';
    this->contexts[context].unused = false;
    return true;
  }
  __assert_fail("contexts[context].unused",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v4.cpp"
                ,0xe8,
                "BOOL LASreadItemCompressed_POINT14_v4::createAndInitModelsAndDecompressors(U32, const U8 *)"
               );
}

Assistant:

inline BOOL LASreadItemCompressed_POINT14_v4::createAndInitModelsAndDecompressors(U32 context, const U8* item)
{
  I32 i;

  /* should only be called when context is unused */

  assert(contexts[context].unused);

  /* first create all entropy models and integer decompressors (if needed) */

  if (contexts[context].m_changed_values[0] == 0)
  {
    /* for the channel_returns_XY layer */

    contexts[context].m_changed_values[0] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[1] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[2] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[3] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[4] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[5] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[6] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_changed_values[7] = dec_channel_returns_XY->createSymbolModel(128);
    contexts[context].m_scanner_channel = dec_channel_returns_XY->createSymbolModel(3);
    for (i = 0; i < 16; i++)
    {
      contexts[context].m_number_of_returns[i] = 0;
      contexts[context].m_return_number[i] = 0;
    }
    contexts[context].m_return_number_gps_same = dec_channel_returns_XY->createSymbolModel(13);

    contexts[context].ic_dX = new IntegerCompressor(dec_channel_returns_XY, 32, 2);  // 32 bits, 2 context
    contexts[context].ic_dY = new IntegerCompressor(dec_channel_returns_XY, 32, 22); // 32 bits, 22 contexts

    /* for the Z layer */

    contexts[context].ic_Z = new IntegerCompressor(dec_Z, 32, 20);  // 32 bits, 20 contexts

    /* for the classification layer */
    /* for the flags layer */
    /* for the user_data layer */

    for (i = 0; i < 64; i++)
    {
      contexts[context].m_classification[i] = 0;
      contexts[context].m_flags[i] = 0;
      contexts[context].m_user_data[i] = 0;
    }

    /* for the intensity layer */

    contexts[context].ic_intensity = new IntegerCompressor(dec_intensity, 16, 4);

    /* for the scan_angle layer */

    contexts[context].ic_scan_angle = new IntegerCompressor(dec_scan_angle, 16, 2);

    /* for the point_source_ID layer */

    contexts[context].ic_point_source_ID = new IntegerCompressor(dec_point_source, 16);

    /* for the gps_time layer */

    contexts[context].m_gpstime_multi = dec_gps_time->createSymbolModel(LASZIP_GPSTIME_MULTI_TOTAL);
    contexts[context].m_gpstime_0diff = dec_gps_time->createSymbolModel(5);
    contexts[context].ic_gpstime = new IntegerCompressor(dec_gps_time, 32, 9); // 32 bits, 9 contexts
  }

  /* then init entropy models and integer compressors */

  /* for the channel_returns_XY layer */

  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[0]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[1]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[2]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[3]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[4]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[5]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[6]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_changed_values[7]);
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_scanner_channel);
  for (i = 0; i < 16; i++)
  {
    if (contexts[context].m_number_of_returns[i]) dec_channel_returns_XY->initSymbolModel(contexts[context].m_number_of_returns[i]);
    if (contexts[context].m_return_number[i]) dec_channel_returns_XY->initSymbolModel(contexts[context].m_return_number[i]);
  }
  dec_channel_returns_XY->initSymbolModel(contexts[context].m_return_number_gps_same);
  contexts[context].ic_dX->initDecompressor();
  contexts[context].ic_dY->initDecompressor();
  for (i = 0; i < 12; i++)
  {
    contexts[context].last_X_diff_median5[i].init();
    contexts[context].last_Y_diff_median5[i].init();
  }

  /* for the Z layer */

  contexts[context].ic_Z->initDecompressor();
  for (i = 0; i < 8; i++)
  {
    contexts[context].last_Z[i] = ((const LASpoint14*)item)->Z;
  }

  /* for the classification layer */
  /* for the flags layer */
  /* for the user_data layer */

  for (i = 0; i < 64; i++)
  {
    if (contexts[context].m_classification[i]) dec_classification->initSymbolModel(contexts[context].m_classification[i]);
    if (contexts[context].m_flags[i]) dec_flags->initSymbolModel(contexts[context].m_flags[i]);
    if (contexts[context].m_user_data[i]) dec_user_data->initSymbolModel(contexts[context].m_user_data[i]);
  }

  /* for the intensity layer */

  contexts[context].ic_intensity->initDecompressor();
  for (i = 0; i < 8; i++)
  {
    contexts[context].last_intensity[i] = ((const LASpoint14*)item)->intensity;
  }

  /* for the scan_angle layer */

  contexts[context].ic_scan_angle->initDecompressor();

  /* for the point_source_ID layer */

  contexts[context].ic_point_source_ID->initDecompressor();

  /* for the gps_time layer */

  dec_gps_time->initSymbolModel(contexts[context].m_gpstime_multi);
  dec_gps_time->initSymbolModel(contexts[context].m_gpstime_0diff);
  contexts[context].ic_gpstime->initDecompressor();
  contexts[context].last = 0, contexts[context].next = 0;
  contexts[context].last_gpstime_diff[0] = 0;
  contexts[context].last_gpstime_diff[1] = 0;
  contexts[context].last_gpstime_diff[2] = 0;
  contexts[context].last_gpstime_diff[3] = 0;
  contexts[context].multi_extreme_counter[0] = 0;
  contexts[context].multi_extreme_counter[1] = 0;
  contexts[context].multi_extreme_counter[2] = 0;
  contexts[context].multi_extreme_counter[3] = 0;
  contexts[context].last_gpstime[0].f64 = ((const LASpoint14*)item)->gps_time;
  contexts[context].last_gpstime[1].u64 = 0;
  contexts[context].last_gpstime[2].u64 = 0;
  contexts[context].last_gpstime[3].u64 = 0;

  /* init current context from last item */

  memcpy(contexts[context].last_item, item, sizeof(LASpoint14));
  ((LASpoint14*)contexts[context].last_item)->gps_time_change = FALSE;

//  LASMessage(LAS_VERBOSE, "INIT: current_context %d last item %.14g %d %d %d %d %d %d", current_context, ((LASpoint14*)item)->gps_time, ((LASpoint14*)item)->X, ((LASpoint14*)item)->Y, ((LASpoint14*)item)->Z, ((LASpoint14*)item)->intensity, ((LASpoint14*)item)->return_number, ((LASpoint14*)item)->number_of_returns);

  contexts[context].unused = FALSE;

  return TRUE;
}